

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpResponse.cpp
# Opt level: O0

bool __thiscall higan::HttpResponse::SetFileToResponse(HttpResponse *this,string *file_path)

{
  FileStatus FVar1;
  element_type *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  byte local_29;
  undefined1 local_28 [7];
  bool add_ok_result;
  undefined1 local_18 [8];
  string *file_path_local;
  HttpResponse *this_local;
  
  local_18 = (undefined1  [8])file_path;
  file_path_local = (string *)this;
  std::make_shared<higan::FileForRead,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_28);
  std::shared_ptr<higan::FileForRead>::operator=
            (&this->file_ptr_,(shared_ptr<higan::FileForRead> *)local_28);
  std::shared_ptr<higan::FileForRead>::~shared_ptr((shared_ptr<higan::FileForRead> *)local_28);
  local_29 = 0;
  this_00 = std::__shared_ptr_access<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->file_ptr_);
  FVar1 = FileForRead::GetFileStatus(this_00);
  switch(FVar1) {
  case NOT_EXIST:
    local_29 = 0;
    break;
  case IS_DIR:
    std::operator+(&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_18,
                   "/index.html");
    local_29 = SetFileToResponse(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    break;
  case OPEN_SUCCESS:
    local_29 = 1;
    break;
  case OPEN_ERROR:
    local_29 = 0;
  }
  if ((local_29 & 1) == 0) {
    std::__shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>::reset
              (&(this->file_ptr_).super___shared_ptr<higan::FileForRead,_(__gnu_cxx::_Lock_policy)2>
              );
  }
  return (bool)(local_29 & 1);
}

Assistant:

bool HttpResponse::SetFileToResponse(const std::string& file_path)
{
	file_ptr_ = std::make_shared<FileForRead>(file_path);

	bool add_ok_result = false;

	switch (file_ptr_->GetFileStatus())
	{
		case FileForRead::FileStatus::NOT_EXIST:
			add_ok_result = false;
			break;
		case FileForRead::FileStatus::IS_DIR:
			add_ok_result = SetFileToResponse(file_path + "/index.html");
			break;
		case FileForRead::FileStatus::OPEN_SUCCESS:
			add_ok_result = true;
			break;
		case FileForRead::FileStatus::OPEN_ERROR:
			add_ok_result = false;
			break;
	}

	if (!add_ok_result)
	{
		file_ptr_.reset();
	}
	return add_ok_result;
}